

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O1

void ON_String::SplitPath
               (char *path,ON_String *drive,ON_String *dir,ON_String *fname,ON_String *ext)

{
  ON_FileSystemPath::SplitPath(path,drive,dir,fname,ext);
  return;
}

Assistant:

void ON_String::SplitPath(
  const char* path,
  ON_String* drive,
  ON_String* dir,
  ON_String* fname,
  ON_String* ext
  )
{
  ON_FileSystemPath::SplitPath(
    path,
    drive,
    dir,
    fname,
    ext
    );
}